

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_MNI_SingleEntryImportExplicitNetworkPass_Test::TestBody
          (InterpreterTestSuite_MNI_SingleEntryImportExplicitNetworkPass_Test *this)

{
  FunctionMocker<bool_()> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined **ppuVar3;
  _func_int **pp_Var4;
  element_type *this_01;
  _Alloc_hider _Var5;
  Registry *this_02;
  bool bVar6;
  CommissionerAppMock *this_03;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_04;
  TypedExpectation<bool_()> *pTVar7;
  ActionInterface<bool_()> *pAVar8;
  TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
  *this_05;
  undefined8 *puVar9;
  long *plVar10;
  char *pcVar11;
  _func_int *p_Var12;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  Status local_50a;
  Status local_509;
  _Any_data local_508;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  undefined1 local_4a0 [8];
  undefined **local_498;
  undefined1 local_490 [8];
  undefined1 auStack_488 [16];
  _Alloc_hider local_478;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  element_type local_468 [2];
  _Any_data local_458;
  code *local_448;
  code *pcStack_440;
  internal local_438 [8];
  _func_int **local_430;
  CommissionerAppMockPtr commissionerAppMock;
  ByteArray local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  State local_388;
  State local_384;
  _func_int *local_380;
  string mepdsFileName;
  UnixTime local_358;
  UnixTime local_350;
  string multiEntryPendingDataset;
  Value value;
  Error local_1b0;
  Error local_188;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  multiEntryPendingDataset._M_dataplus._M_p = (pointer)&multiEntryPendingDataset.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&multiEntryPendingDataset,
             "\n{\n    \"DelayTimer\": 60000, // in milliseconds\n    \"PendingTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ActiveTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ExtendedPanId\": \"1122334455667788\",\n    \"NetworkName\": \"net1\",\n    \"SecurityPolicy\": {\n        \"Flags\": \"ff\",\n        \"RotationTime\": 673\n    }\n}"
             ,"");
  mepdsFileName._M_dataplus._M_p = (pointer)&mepdsFileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mepdsFileName,"./mepds.json","");
  ot::commissioner::WriteFile(&value.mError,&multiEntryPendingDataset,&mepdsFileName);
  local_508._0_4_ = value.mError.mCode;
  local_4c8._0_8_ = (ulong)(uint)local_4c8._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)local_4a0,"WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode()",
             "ErrorCode::kNone",(ErrorCode *)local_508._M_pod_data,(ErrorCode *)local_4c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value.mError.mMessage._M_dataplus._M_p != &value.mError.mMessage.field_2) {
    operator_delete(value.mError.mMessage._M_dataplus._M_p);
  }
  ppuVar3 = local_498;
  if ((internal)local_4a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&value);
    if ((_func_int **)local_498 == (_func_int **)0x0) {
      p_Var12 = (_func_int *)0x2ff875;
    }
    else {
      p_Var12 = (_func_int *)*local_498;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_508,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xc37,(char *)p_Var12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_508,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_508);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
    if ((_func_int **)local_498 == (_func_int **)0x0) goto LAB_001a3ed1;
    local_430 = (_func_int **)local_498;
    if ((_func_int **)*local_498 != (_func_int **)((long)local_498 + 0x10)) {
      operator_delete(*local_498);
    }
  }
  else {
    if ((_func_int **)local_498 != (_func_int **)0x0) {
      if ((_func_int **)*local_498 != (_func_int **)((long)local_498 + 0x10)) {
        operator_delete(*local_498);
      }
      operator_delete(ppuVar3);
    }
    local_4a0 = (undefined1  [8])0x0;
    testing::internal::
    CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
              ((internal *)&value,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)local_4a0);
    _Var5 = value.mError.mMessage._M_dataplus;
    if ((undefined1)value.mError.mCode == kNone) {
      testing::Message::Message((Message *)local_4a0);
      if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = *(char **)value.mError.mMessage._M_dataplus._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_508,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xc39,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_508,(Message *)local_4a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_508);
      if (local_4a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_4a0 + 8))();
      }
      local_430 = (_func_int **)value.mError.mMessage._M_dataplus._M_p;
      if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) goto LAB_001a3ed1;
      if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10)
      {
        operator_delete(*value.mError.mMessage._M_dataplus._M_p);
      }
    }
    else {
      if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
        if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10
           ) {
          operator_delete(*value.mError.mMessage._M_dataplus._M_p);
        }
        operator_delete(_Var5._M_p);
      }
      this_02 = ctx.mRegistry;
      local_4a0 = (undefined1  [8])local_490;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"127.0.0.1","");
      commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_508._M_unused._M_object = local_4f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"1.1","");
      ot::commissioner::BorderAgent::State::State(&local_384,0,0,0,0,0);
      local_4c8._0_8_ = &local_4b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"net1","");
      local_4e8._0_8_ = local_4d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"");
      local_458._M_unused._M_object = &local_448;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"");
      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"");
      local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"domain1","");
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      p_Var12 = (_func_int *)0x2ff875;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"","");
      ot::commissioner::UnixTime::UnixTime(&local_350,0);
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&value,(string *)local_4a0,0x4e21,(ByteArray *)&commissionerAppMock,
                 (string *)&local_508,local_384,(string *)local_4c8,0x1122334455667788,
                 (string *)local_4e8,(string *)&local_458,(Timestamp)0x0,0,&local_3e8,&local_408,
                 &local_3a8,'\0',0,&local_3c8,local_350,0x101f);
      local_509 = ot::commissioner::persistent_storage::Registry::Add(this_02,(BorderAgent *)&value)
      ;
      local_50a = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                (local_438,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 0x1122334455667788ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_509,&local_50a);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      if ((code **)local_458._M_unused._0_8_ != &local_448) {
        operator_delete(local_458._M_unused._M_object);
      }
      if ((undefined1 *)local_4e8._0_8_ != local_4d8) {
        operator_delete((void *)local_4e8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._0_8_ != &local_4b8) {
        operator_delete((void *)local_4c8._0_8_);
      }
      if ((undefined1 *)local_508._M_unused._0_8_ != local_4f8) {
        operator_delete(local_508._M_unused._M_object);
      }
      if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        operator_delete(commissionerAppMock.
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (local_4a0 != (undefined1  [8])local_490) {
        operator_delete((void *)local_4a0);
      }
      pp_Var4 = local_430;
      if (local_438[0] == (internal)0x0) {
        testing::Message::Message((Message *)&value);
        if (local_430 != (_func_int **)0x0) {
          p_Var12 = *local_430;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xc3d,(char *)p_Var12);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4a0,(Message *)&value);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4a0);
        if (value.mError._0_8_ != 0) {
          (**(code **)(*(long *)value.mError._0_8_ + 8))();
        }
        if (local_430 == (_func_int **)0x0) goto LAB_001a3ed1;
        if ((_func_int **)*local_430 != local_430 + 2) {
          operator_delete(*local_430);
        }
      }
      else {
        if (local_430 != (_func_int **)0x0) {
          if ((_func_int **)*local_430 != local_430 + 2) {
            operator_delete(*local_430);
          }
          operator_delete(pp_Var4);
        }
        local_4a0 = (undefined1  [8])local_490;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"127.0.0.2","");
        commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_508._M_unused._M_object = local_4f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"1.1","");
        ot::commissioner::BorderAgent::State::State(&local_388,0,0,0,0,0);
        local_4c8._0_8_ = &local_4b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"net2","");
        local_4e8._0_8_ = local_4d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"");
        local_458._M_unused._M_object = &local_448;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"");
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"");
        local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"domain2","");
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        local_380 = (_func_int *)0x2ff875;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8);
        ot::commissioner::UnixTime::UnixTime(&local_358,0);
        pcVar11 = (char *)(ulong)(uint)local_388;
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&value,(string *)local_4a0,0x4e22,
                   (ByteArray *)&commissionerAppMock,(string *)&local_508,local_388,
                   (string *)local_4c8,0x99aabbccddeeff00,(string *)local_4e8,(string *)&local_458,
                   (Timestamp)0x0,0,&local_3e8,&local_408,&local_3a8,'\0',0,&local_3c8,local_358,
                   0x101f);
        local_509 = ot::commissioner::persistent_storage::Registry::Add
                              (ctx.mRegistry,(BorderAgent *)&value);
        local_50a = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  (local_438,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 0x99AABBCCDDEEFF00ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",&local_509,&local_50a);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_408.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        if ((code **)local_458._M_unused._0_8_ != &local_448) {
          operator_delete(local_458._M_unused._M_object);
        }
        if ((undefined1 *)local_4e8._0_8_ != local_4d8) {
          operator_delete((void *)local_4e8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._0_8_ != &local_4b8) {
          operator_delete((void *)local_4c8._0_8_);
        }
        if ((undefined1 *)local_508._M_unused._0_8_ != local_4f8) {
          operator_delete(local_508._M_unused._M_object);
        }
        if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          operator_delete(commissionerAppMock.
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         );
        }
        if (local_4a0 != (undefined1  [8])local_490) {
          operator_delete((void *)local_4a0);
        }
        if (local_438[0] != (internal)0x0) {
          if (local_430 != (_func_int **)0x0) {
            if ((_func_int **)*local_430 != local_430 + 2) {
              operator_delete(*local_430);
            }
            operator_delete(local_430);
          }
          this_03 = (CommissionerAppMock *)operator_new(0x1838);
          memset(this_03,0,0x1838);
          CommissionerAppMock::CommissionerAppMock(this_03);
          commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = this_03;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                    (&commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,this_03);
          local_3e8._M_string_length = (size_type)operator_new(8);
          (((MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
           local_3e8._M_string_length)->super_MatcherDescriberInterface).
          _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_0039a928;
          local_3e8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d20;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_3e8.field_2._M_allocated_capacity,
                     (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                     local_3e8._M_string_length);
          local_3e8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395cd8;
          local_3a8._M_string_length = (size_type)operator_new(8);
          (((MatcherInterface<const_ot::commissioner::Config_&> *)local_3a8._M_string_length)->
          super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
               (_func_int **)&PTR__MatcherDescriberInterface_0039a9e0;
          local_3a8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d88;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_3a8.field_2._M_allocated_capacity,
                     (MatcherInterface<const_ot::commissioner::Config_&> *)
                     local_3a8._M_string_length);
          local_3a8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d40;
          CommissionerAppStaticExpecter::gmock_Create
                    ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      *)local_4a0,&ctx.mCommissionerAppStaticExpecter,
                     (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_3e8,
                     (Matcher<const_ot::commissioner::Config_&> *)&local_3a8);
          testing::internal::GetWithoutMatchers();
          this_04 = testing::internal::
                    MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                    ::InternalExpectedAt
                              ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                *)local_4a0,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0xc44,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
          paVar1 = &local_188.mMessage.field_2;
          local_188.mCode = kNone;
          local_188.mMessage._M_string_length = 0;
          local_188.mMessage.field_2._M_local_buf[0] = '\0';
          local_188.mMessage._M_dataplus._M_p = (pointer)paVar1;
          testing::Return<ot::commissioner::Error>((testing *)&local_408,&local_188);
          local_3c8._M_dataplus._M_p =
               (pointer)local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_3c8._M_string_length =
               (size_type)
               local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)
               ((long)local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish + 8) =
                   *(_Atomic_word *)
                    ((long)local_408.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)
               ((long)local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish + 8) =
                   *(_Atomic_word *)
                    ((long)local_408.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + 8) + 1;
            }
          }
          local_508._M_unused._M_object = &commissionerAppMock;
          local_508._8_8_ = 0;
          local_4f8._0_8_ =
               std::
               _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:3142:30)>
               ::_M_manager;
          local_4f8._8_8_ =
               std::
               _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:3142:30)>
               ::_M_invoke;
          local_3c8.field_2._M_allocated_capacity = (size_type)local_508._M_unused._M_object;
          std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                    ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                     local_4c8,
                     (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                     &local_508);
          local_4d8._0_8_ = 0;
          local_4d8._8_8_ = 0;
          local_4e8._0_8_ = (pointer)0x0;
          local_4e8._8_8_ = 0;
          local_4e8._0_8_ = operator_new(0x20);
          *(undefined8 *)local_4e8._0_8_ = kNone;
          *(undefined8 *)(local_4e8._0_8_ + 8) = kNone;
          *(undefined8 *)(local_4e8._0_8_ + 0x10) = kNone;
          *(undefined8 *)(local_4e8._0_8_ + 0x18) = local_4b8._8_8_;
          if (local_4b8._M_allocated_capacity != kNone) {
            *(undefined4 *)local_4e8._0_8_ = local_4c8._0_4_;
            *(undefined4 *)(local_4e8._0_8_ + 4) = local_4c8._4_4_;
            *(undefined4 *)(local_4e8._0_8_ + 8) = local_4c8._8_4_;
            *(undefined4 *)(local_4e8._0_8_ + 0xc) = local_4c8._12_4_;
            *(size_type *)(local_4e8._0_8_ + 0x10) = local_4b8._M_allocated_capacity;
          }
          local_4e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_4d8._0_8_ = std::_Function_handler::operator_cast_to_Action;
          local_4d8._8_8_ = std::_Function_handler::operator_cast_to_Action;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            (*(code *)local_4f8._0_8_)(&local_508,&local_508,3);
          }
          __l._M_len = 1;
          __l._M_array = (iterator)local_4e8;
          std::
          vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
          ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                    *)&value,__l,(allocator_type *)local_508._M_pod_data);
          if ((code *)local_4d8._0_8_ != (code *)0x0) {
            (*(code *)local_4d8._0_8_)(local_4e8,local_4e8,3);
          }
          testing::internal::ReturnAction::operator_cast_to_Action
                    ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      *)&value.mError.mMessage.field_2,(ReturnAction *)&local_3c8);
          local_448 = (code *)0x0;
          pcStack_440 = (code *)0x0;
          local_458._M_unused._M_object = (void *)0x0;
          local_458._8_8_ = 0;
          local_458._M_unused._M_object = operator_new(0x38);
          *(undefined8 *)local_458._M_unused._0_8_ = value.mError._0_8_;
          *(pointer *)((long)local_458._M_unused._0_8_ + 8) = value.mError.mMessage._M_dataplus._M_p
          ;
          *(size_type *)((long)local_458._M_unused._0_8_ + 0x10) =
               value.mError.mMessage._M_string_length;
          value.mError.mMessage._M_string_length = 0;
          value.mError.mCode = kNone;
          value.mError._4_4_ = 0;
          value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
          *(undefined8 *)((long)local_458._M_unused._0_8_ + 0x28) = 0;
          *(undefined8 *)((long)local_458._M_unused._0_8_ + 0x18) = 0;
          *(undefined8 *)((long)local_458._M_unused._0_8_ + 0x20) = 0;
          *(size_type *)((long)local_458._M_unused._0_8_ + 0x30) = value.mData._M_string_length;
          if (value.mData._M_dataplus._M_p != (pointer)0x0) {
            *(ulong *)((long)local_458._M_unused._0_8_ + 0x18) =
                 CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                          value.mError.mMessage.field_2._M_local_buf[0]);
            *(undefined8 *)((long)local_458._M_unused._0_8_ + 0x20) =
                 value.mError.mMessage.field_2._8_8_;
            *(pointer *)((long)local_458._M_unused._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
            value.mData._M_dataplus._M_p = (pointer)0x0;
            value.mData._M_string_length = 0;
          }
          local_458._8_8_ = 0;
          local_448 = std::_Function_handler::operator_cast_to_Action;
          pcStack_440 = std::_Function_handler::operator_cast_to_Action;
          std::
          vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
          ::~vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                     *)&value);
          testing::internal::
          TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
          ::WillOnce(this_04,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                              *)&local_458);
          if (local_448 != (code *)0x0) {
            (*local_448)(&local_458,&local_458,3);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._M_string_length);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.mMessage._M_dataplus._M_p != paVar1) {
            operator_delete(local_188.mMessage._M_dataplus._M_p);
          }
          auStack_488._8_8_ = &PTR__MatcherBase_00395d20;
          if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
          }
          local_498 = &PTR__MatcherBase_00395d88;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_488._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_488._0_8_);
          }
          local_3a8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d88;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_3a8.field_2._M_allocated_capacity !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_3a8.field_2._M_allocated_capacity);
          }
          local_3e8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d20;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_3e8.field_2._M_allocated_capacity !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_3e8.field_2._M_allocated_capacity);
          }
          this_00 = &(commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     gmock10_IsActive_81;
          testing::internal::UntypedFunctionMockerBase::RegisterOwner
                    (&this_00->super_UntypedFunctionMockerBase,
                     commissionerAppMock.
                     super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          local_508._M_unused._0_8_ = (undefined8)this_00;
          testing::internal::GetWithoutMatchers();
          pTVar7 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                             ((MockSpec<bool_()> *)&local_508,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0xc47,"*commissionerAppMock","IsActive()");
          local_4c8._0_8_ = operator_new(1);
          *(bool *)local_4c8._0_8_ = false;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4c8 + 8),
                     (bool *)local_4c8._0_8_);
          pAVar8 = (ActionInterface<bool_()> *)operator_new(0x10);
          pAVar8->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b808;
          bVar6 = *(bool *)local_4c8._0_8_;
          *(bool *)&pAVar8[1]._vptr_ActionInterface = bVar6;
          *(bool *)((long)&pAVar8[1]._vptr_ActionInterface + 1) = bVar6;
          testing::Action<bool_()>::Action((Action<bool_()> *)&value,pAVar8);
          pTVar7 = testing::internal::TypedExpectation<bool_()>::WillOnce
                             (pTVar7,(Action<bool_()> *)&value);
          local_4e8._0_8_ = operator_new(1);
          *(bool *)local_4e8._0_8_ = true;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4e8 + 8),
                     (bool *)local_4e8._0_8_);
          pAVar8 = (ActionInterface<bool_()> *)operator_new(0x10);
          pAVar8->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b808;
          bVar6 = *(bool *)local_4e8._0_8_;
          *(bool *)&pAVar8[1]._vptr_ActionInterface = bVar6;
          *(bool *)((long)&pAVar8[1]._vptr_ActionInterface + 1) = bVar6;
          testing::Action<bool_()>::Action((Action<bool_()> *)local_4a0,pAVar8);
          testing::internal::TypedExpectation<bool_()>::WillOnce
                    (pTVar7,(Action<bool_()> *)local_4a0);
          if (local_490 != (undefined1  [8])0x0) {
            (*(code *)local_490)(local_4a0,local_4a0,3);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_);
          }
          if (value.mError.mMessage._M_string_length != 0) {
            (*(code *)value.mError.mMessage._M_string_length)(&value,&value,3);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._8_8_);
          }
          this_01 = commissionerAppMock.
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_508._8_8_ = operator_new(8);
          (((MatcherInterface<const_ot::commissioner::ActiveOperationalDataset_&> *)local_508._8_8_)
          ->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
               (_func_int **)&PTR__MatcherDescriberInterface_0039af70;
          local_508._M_unused._M_object = &PTR__MatcherBase_00398350;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_const&>const*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4f8,
                     (MatcherInterface<const_ot::commissioner::ActiveOperationalDataset_&> *)
                     local_508._8_8_);
          local_508._M_unused._M_object = &PTR__MatcherBase_00398308;
          CommissionerAppMock::gmock_SetActiveDataset
                    ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                      *)&value,this_01,
                     (Matcher<const_ot::commissioner::ActiveOperationalDataset_&> *)&local_508);
          testing::internal::GetWithoutMatchers();
          this_05 = testing::internal::
                    MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                    ::InternalExpectedAt
                              ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                                *)&value,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0xc48,"*commissionerAppMock","SetActiveDataset(_)");
          paVar1 = &local_1b0.mMessage.field_2;
          local_1b0.mCode = kNone;
          local_1b0.mMessage._M_string_length = 0;
          local_1b0.mMessage.field_2._M_local_buf[0] = '\0';
          local_1b0.mMessage._M_dataplus._M_p = (pointer)paVar1;
          testing::Return<ot::commissioner::Error>((testing *)local_4c8,&local_1b0);
          testing::internal::ReturnAction::operator_cast_to_Action
                    ((Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                      *)local_4a0,(ReturnAction *)local_4c8);
          testing::internal::
          TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
          ::WillOnce(this_05,(Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                              *)local_4a0);
          if (local_490 != (undefined1  [8])0x0) {
            (*(code *)local_490)(local_4a0,local_4a0,3);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0.mMessage._M_dataplus._M_p != paVar1) {
            operator_delete(local_1b0.mMessage._M_dataplus._M_p);
          }
          value.mError.mMessage._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00398350;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                       value.mError.mMessage.field_2._M_local_buf[0]) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                                value.mError.mMessage.field_2._M_local_buf[0]));
          }
          local_508._M_unused._M_object = &PTR__MatcherBase_00398350;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8._0_8_);
          }
          local_4d8._0_8_ = 0;
          local_4e8._0_8_ = (pointer)0x0;
          local_4e8._8_8_ = 0;
          paVar1 = &value.mData.field_2;
          value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
          value.mError.mMessage._M_string_length = 0;
          value.mError.mMessage.field_2._M_local_buf[0] = '\0';
          value.mData._M_string_length = 0;
          value.mData.field_2._M_local_buf[0] = '\0';
          local_4a0 = (undefined1  [8])local_490;
          value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
          value.mData._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"start --nwk net1","")
          ;
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)local_4c8,&ctx.mInterpreter,(string *)local_4a0);
          local_4f8._0_8_ = local_4d8._0_8_;
          local_508._8_8_ = local_4e8._8_8_;
          local_508._M_unused._0_8_ = (undefined8)local_4e8._0_8_;
          local_4d8._0_8_ = local_4b8._M_allocated_capacity;
          local_4e8._0_8_ = local_4c8._0_8_;
          local_4e8._8_8_ = local_4c8._8_8_;
          local_4c8._0_8_ = (long *)0x0;
          local_4c8._8_8_ = 0;
          local_4b8._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_508);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4c8);
          if (local_4a0 != (undefined1  [8])local_490) {
            operator_delete((void *)local_4a0);
          }
          ot::commissioner::Interpreter::Eval
                    ((Value *)local_4a0,&ctx.mInterpreter,(Expression *)local_4e8);
          bVar6 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_4a0);
          local_508._M_pod_data[0] = bVar6;
          local_508._8_8_ = (undefined8 *)0x0;
          if ((element_type *)local_478._M_p != local_468) {
            operator_delete(local_478._M_p);
          }
          if (local_498 != (undefined **)auStack_488) {
            operator_delete(local_498);
          }
          if (local_508._M_pod_data[0] == '\0') {
            testing::Message::Message((Message *)local_4c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_4a0,(internal *)local_508._M_pod_data,
                       (AssertionResult *)"ctx.mInterpreter.Eval(expr).HasNoError()","false","true",
                       pcVar11);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xc4d,(char *)local_4a0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_4c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
            if (local_4a0 != (undefined1  [8])local_490) {
              operator_delete((void *)local_4a0);
            }
            if ((long *)local_4c8._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_4c8._0_8_ + 8))();
            }
          }
          uVar2 = local_508._8_8_;
          if ((undefined8 *)local_508._8_8_ != (undefined8 *)0x0) {
            if (*(undefined8 **)local_508._8_8_ != (undefined8 *)(local_508._8_8_ + 0x10)) {
              operator_delete(*(undefined8 **)local_508._8_8_);
            }
            operator_delete((void *)uVar2);
          }
          ot::commissioner::Interpreter::MultiNetCommandContext::Cleanup
                    ((MultiNetCommandContext *)&ctx);
          ot::commissioner::JobManager::CleanupJobs
                    (ctx.mInterpreter.mJobManager.
                     super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          local_508._M_unused._M_object = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_508,"opdataset set active --nwk net1 --import ","");
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             (local_508._M_pod_data,(ulong)mepdsFileName._M_dataplus._M_p);
          local_4a0 = (undefined1  [8])local_490;
          plVar10 = puVar9 + 2;
          if ((long *)*puVar9 == plVar10) {
            local_490 = (undefined1  [8])*plVar10;
            auStack_488._0_8_ = puVar9[3];
          }
          else {
            local_490 = (undefined1  [8])*plVar10;
            local_4a0 = (undefined1  [8])*puVar9;
          }
          local_498 = (undefined **)puVar9[1];
          *puVar9 = plVar10;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)&local_458,&ctx.mInterpreter,(string *)local_4a0);
          local_4b8._M_allocated_capacity = local_4d8._0_8_;
          local_4c8._8_8_ = local_4e8._8_8_;
          local_4c8._0_8_ = local_4e8._0_8_;
          local_4d8._0_8_ = local_448;
          local_4e8._0_8_ = local_458._M_unused._M_object;
          local_4e8._8_8_ = local_458._8_8_;
          local_458._M_unused._M_object = (code **)0x0;
          local_458._8_8_ = 0;
          local_448 = (code *)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_458);
          if (local_4a0 != (undefined1  [8])local_490) {
            operator_delete((void *)local_4a0);
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_508._M_unused._0_8_ !=
              (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4f8) {
            operator_delete(local_508._M_unused._M_object);
          }
          ot::commissioner::Interpreter::Eval
                    ((Value *)local_4a0,&ctx.mInterpreter,(Expression *)local_4e8);
          value.mError.mCode = local_4a0._0_4_;
          std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&local_498);
          std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_478);
          if ((element_type *)local_478._M_p != local_468) {
            operator_delete(local_478._M_p);
          }
          if (local_498 != (undefined **)auStack_488) {
            operator_delete(local_498);
          }
          bVar6 = ot::commissioner::Interpreter::Value::HasNoError(&value);
          local_508._M_pod_data[0] = bVar6;
          local_508._8_8_ = (undefined8 *)0x0;
          if (!bVar6) {
            testing::Message::Message((Message *)local_4c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_4a0,(internal *)local_508._M_pod_data,
                       (AssertionResult *)0x2ddeee,"false","true",pcVar11);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xc53,(char *)local_4a0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_4c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
            if (local_4a0 != (undefined1  [8])local_490) {
              operator_delete((void *)local_4a0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_4c8._0_8_ + 8))();
            }
            uVar2 = local_508._8_8_;
            if ((undefined8 *)local_508._8_8_ != (undefined8 *)0x0) {
              if (*(undefined8 **)local_508._8_8_ != (undefined8 *)(local_508._8_8_ + 0x10)) {
                operator_delete(*(undefined8 **)local_508._8_8_);
              }
              operator_delete((void *)uVar2);
            }
          }
          unlink(mepdsFileName._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value.mData._M_dataplus._M_p != paVar1) {
            operator_delete(value.mData._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value.mError.mMessage._M_dataplus._M_p != &value.mError.mMessage.field_2) {
            operator_delete(value.mError.mMessage._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4e8);
          if (commissionerAppMock.
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (commissionerAppMock.
                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          goto LAB_001a3ed1;
        }
        testing::Message::Message((Message *)&value);
        if (local_430 != (_func_int **)0x0) {
          local_380 = *local_430;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xc41,(char *)local_380);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4a0,(Message *)&value);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4a0);
        if (value.mError._0_8_ != 0) {
          (**(code **)(*(long *)value.mError._0_8_ + 8))();
        }
        if (local_430 == (_func_int **)0x0) goto LAB_001a3ed1;
        if ((_func_int **)*local_430 != local_430 + 2) {
          operator_delete(*local_430);
        }
      }
    }
  }
  operator_delete(local_430);
LAB_001a3ed1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mepdsFileName._M_dataplus._M_p != &mepdsFileName.field_2) {
    operator_delete(mepdsFileName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)multiEntryPendingDataset._M_dataplus._M_p != &multiEntryPendingDataset.field_2) {
    operator_delete(multiEntryPendingDataset._M_dataplus._M_p);
  }
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNI_SingleEntryImportExplicitNetworkPass)
{
    TestContext ctx;
    InitContext(ctx);

    const std::string multiEntryPendingDataset = "\n\
{\n\
    \"DelayTimer\": 60000, // in milliseconds\n\
    \"PendingTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ExtendedPanId\": \"1122334455667788\",\n\
    \"NetworkName\": \"net1\",\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"ff\",\n\
        \"RotationTime\": 673\n\
    }\n\
}";
    const std::string mepdsFileName            = "./mepds.json";
    ASSERT_EQ(WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode(), ErrorCode::kNone);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 0x1122334455667788ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain1", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 0x99AABBCCDDEEFF00ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain2", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    CommissionerAppMockPtr commissionerAppMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMock; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMock, IsActive()).WillOnce(Return(false)).WillOnce(Return(true));
    EXPECT_CALL(*commissionerAppMock, SetActiveDataset(_)).WillOnce(Return(Error{}));
    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr = ctx.mInterpreter.ParseExpression("start --nwk net1");
    EXPECT_TRUE(ctx.mInterpreter.Eval(expr).HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    expr  = ctx.mInterpreter.ParseExpression(std::string("opdataset set active --nwk net1 --import ") + mepdsFileName);
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    unlink(mepdsFileName.c_str());
}